

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O0

bool __thiscall RenX_ExtraLoggingPlugin::initialize(RenX_ExtraLoggingPlugin *this)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  FILE *pFVar6;
  byte local_259;
  undefined1 local_198 [8];
  string line;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  undefined1 local_140 [8];
  string logFile;
  string local_110;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string_view local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  RenX_ExtraLoggingPlugin *local_10;
  RenX_ExtraLoggingPlugin *this_local;
  
  local_10 = this;
  local_40 = sv("FilePrefix",10);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (RenX::tags + 0x15a8));
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (RenX::tags + 0x15a8));
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (RenX::tags + 0x1728));
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (RenX::tags + 0x1728));
  string_printf_abi_cxx11_(&local_60,"[%.*s] %.*s",sVar2,pcVar3,sVar4,pcVar5);
  Jupiter::Config::get<std::__cxx11::string>
            (&local_30,(Config *)&this->field_0x38,local_40,&local_60);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->filePrefix,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_60);
  local_a0 = sv("ConsolePrefix",0xd);
  std::__cxx11::string::string((string *)&local_c0,&this->filePrefix);
  Jupiter::Config::get<std::__cxx11::string>
            (&local_90,(Config *)&this->field_0x38,local_a0,&local_c0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->consolePrefix,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  local_f0 = sv("NewDayFormat",0xc);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (RenX::tags + 0x15a8));
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (RenX::tags + 0x15a8));
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (RenX::tags + 0x1588));
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (RenX::tags + 0x1588));
  string_printf_abi_cxx11_(&local_110,"Time: %.*s %.*s",sVar2,pcVar3,sVar4,pcVar5);
  Jupiter::Config::get<std::__cxx11::string>
            (&local_e0,(Config *)&this->field_0x38,local_f0,&local_110);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->newDayFmt,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_110);
  join_0x00000010_0x00000000_ = sv("PrintToConsole",0xe);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,join_0x00000010_0x00000000_,true);
  this->printToConsole = bVar1;
  local_160 = sv("LogFile",7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170);
  local_150 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_160._M_len,local_160._M_str,local_170._M_len,
                         local_170._M_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_140,&local_150,(allocator<char> *)(line.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
  RenX::sanitizeTags((string *)&this->filePrefix);
  RenX::sanitizeTags((string *)&this->consolePrefix);
  RenX::sanitizeTags((string *)&this->newDayFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
  ;
  if (bVar1) {
    this->file = (FILE *)0x0;
  }
  else {
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_140);
    pFVar6 = fopen(pcVar3,"a+b");
    this->file = (FILE *)pFVar6;
    if (this->file != (FILE *)0x0) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&this->newDayFmt);
      if (!bVar1) {
        std::__cxx11::string::string((string *)local_198,&this->newDayFmt);
        RenX::processTags((string *)local_198,(Server *)0x0,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                          (BuildingInfo *)0x0);
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198
                     );
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
        ;
        fwrite(pcVar3,1,sVar2,(FILE *)this->file);
        fputs("\r\n",(FILE *)this->file);
        std::__cxx11::string::~string((string *)local_198);
      }
    }
  }
  local_259 = 1;
  if (this->file == (FILE *)0x0) {
    local_259 = this->printToConsole;
  }
  std::__cxx11::string::~string((string *)local_140);
  return (bool)(local_259 & 1);
}

Assistant:

bool RenX_ExtraLoggingPlugin::initialize() {
	RenX_ExtraLoggingPlugin::filePrefix = this->config.get("FilePrefix"sv, string_printf("[%.*s] %.*s", RenX::tags->timeTag.size(),
		RenX::tags->timeTag.data(), RenX::tags->serverPrefixTag.size(),
		RenX::tags->serverPrefixTag.data()));
	RenX_ExtraLoggingPlugin::consolePrefix = this->config.get("ConsolePrefix"sv, RenX_ExtraLoggingPlugin::filePrefix);
	RenX_ExtraLoggingPlugin::newDayFmt = this->config.get("NewDayFormat"sv, string_printf("Time: %.*s %.*s", RenX::tags->timeTag.size(),
		RenX::tags->timeTag.data(), RenX::tags->dateTag.size(),
		RenX::tags->dateTag.data()));
	RenX_ExtraLoggingPlugin::printToConsole = this->config.get<bool>("PrintToConsole"sv, true);
	const std::string logFile = static_cast<std::string>(this->config.get("LogFile"sv));

	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::filePrefix);
	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::consolePrefix);
	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::newDayFmt);

	if (!logFile.empty()) {
		RenX_ExtraLoggingPlugin::file = fopen(logFile.c_str(), "a+b");
		if (RenX_ExtraLoggingPlugin::file != nullptr && !RenX_ExtraLoggingPlugin::newDayFmt.empty()) {
			std::string line = RenX_ExtraLoggingPlugin::newDayFmt;
			RenX::processTags(line);
			fwrite(line.data(), sizeof(char), line.size(), file);
			fputs("\r\n", file);
		}
	}
	else
		RenX_ExtraLoggingPlugin::file = nullptr;

	return RenX_ExtraLoggingPlugin::file != nullptr || RenX_ExtraLoggingPlugin::printToConsole;
}